

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

void rf_gfx_vertex3f(float x,float y,float z)

{
  int *piVar1;
  int iVar2;
  rf_render_batch *prVar3;
  long lVar4;
  rf_vertex_buffer *prVar5;
  rf_gfx_vertex_data_type *prVar6;
  long in_FS_OFFSET;
  float fVar7;
  float fVar8;
  float fVar9;
  
  if ((rf__ctx->field_0).transform_matrix_required == true) {
    fVar9 = x * (rf__ctx->field_0).transform.m1;
    fVar8 = y * (rf__ctx->field_0).transform.m6;
    fVar7 = x * (rf__ctx->field_0).transform.m2;
    x = (rf__ctx->field_0).transform.m12 +
        z * (rf__ctx->field_0).transform.m8 +
        x * (rf__ctx->field_0).transform.m0 + y * (rf__ctx->field_0).transform.m4;
    y = (rf__ctx->field_0).transform.m13 +
        z * (rf__ctx->field_0).transform.m9 + fVar9 + y * (rf__ctx->field_0).transform.m5;
    z = z * (rf__ctx->field_0).transform.m10 + fVar7 + fVar8 + (rf__ctx->field_0).transform.m14;
  }
  prVar3 = (rf__ctx->field_0).current_batch;
  lVar4 = prVar3->current_buffer;
  prVar5 = prVar3->vertex_buffers;
  iVar2 = prVar5[lVar4].v_counter;
  if (prVar5[lVar4].elements_count * 4 <= iVar2) {
    rf_log_impl(8,0x17c340,(char *)0x6);
    *(char **)(in_FS_OFFSET + -0x450) =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    *(char **)(in_FS_OFFSET + -0x448) = "rf_gfx_vertex3f";
    *(undefined8 *)(in_FS_OFFSET + -0x440) = 0x9ba5;
    *(undefined4 *)(in_FS_OFFSET + -0x438) = 6;
    return;
  }
  prVar6 = prVar5[lVar4].vertices;
  *(ulong *)(prVar6 + (long)iVar2 * 3) = CONCAT44(y,x);
  prVar6[(long)iVar2 * 3 + 2] = z;
  prVar5[lVar4].v_counter = iVar2 + 1;
  piVar1 = &prVar3->draw_calls[prVar3->draw_calls_counter + -1].vertex_count;
  *piVar1 = *piVar1 + 1;
  return;
}

Assistant:

RF_API void rf_gfx_vertex3f(float x, float y, float z)
{
    rf_vec3 vec = {x, y, z };

    // rf_transform provided vector if required
    if (rf_ctx.transform_matrix_required) vec = rf_vec3_transform(vec, rf_ctx.transform);

    // Verify that rf_max_batch_elements limit not reached
    if (rf_batch.vertex_buffers[rf_batch.current_buffer].v_counter < (rf_batch.vertex_buffers[rf_batch.current_buffer].elements_count * 4))
    {
        rf_batch.vertex_buffers[rf_batch.current_buffer].vertices[3*rf_batch.vertex_buffers[rf_batch.current_buffer].v_counter] = vec.x;
        rf_batch.vertex_buffers[rf_batch.current_buffer].vertices[3*rf_batch.vertex_buffers[rf_batch.current_buffer].v_counter + 1] = vec.y;
        rf_batch.vertex_buffers[rf_batch.current_buffer].vertices[3*rf_batch.vertex_buffers[rf_batch.current_buffer].v_counter + 2] = vec.z;
        rf_batch.vertex_buffers[rf_batch.current_buffer].v_counter++;

        rf_batch.draw_calls[rf_batch.draw_calls_counter - 1].vertex_count++;
    }
    else RF_LOG_ERROR(RF_LIMIT_REACHED, "Render batch elements limit reached. Max bacht elements: %d", rf_batch.vertex_buffers[rf_batch.current_buffer].elements_count * 4);
}